

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutPt * ClipperLib::DupOutPt(OutPt *outPt,bool InsertAfter)

{
  OutPt *this;
  OutPt *result;
  bool InsertAfter_local;
  OutPt *outPt_local;
  
  this = (OutPt *)operator_new(0x28);
  OutPt::OutPt(this);
  (this->Pt).X = (outPt->Pt).X;
  (this->Pt).Y = (outPt->Pt).Y;
  this->Idx = outPt->Idx;
  if (InsertAfter) {
    this->Next = outPt->Next;
    this->Prev = outPt;
    outPt->Next->Prev = this;
    outPt->Next = this;
  }
  else {
    this->Prev = outPt->Prev;
    this->Next = outPt;
    outPt->Prev->Next = this;
    outPt->Prev = this;
  }
  return this;
}

Assistant:

OutPt* DupOutPt(OutPt* outPt, bool InsertAfter)
{
  OutPt* result = new OutPt;
  result->Pt = outPt->Pt;
  result->Idx = outPt->Idx;
  if (InsertAfter)
  {
    result->Next = outPt->Next;
    result->Prev = outPt;
    outPt->Next->Prev = result;
    outPt->Next = result;
  } 
  else
  {
    result->Prev = outPt->Prev;
    result->Next = outPt;
    outPt->Prev->Next = result;
    outPt->Prev = result;
  }
  return result;
}